

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall DReachabilityPropagator::add_innode(DReachabilityPropagator *this,int i)

{
  undefined4 in_ESI;
  value_type_conflict *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  value_type_conflict *__x;
  
  __x = in_RDI;
  Tint::operator++((Tint *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
  in_RDI[0x2b] = in_RDI[0x2b] + 1;
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,__x);
  return;
}

Assistant:

void DReachabilityPropagator::add_innode(int i) {
	if (DEBUG) {
		std::cout << "Adding innode " << i << '\n';
	}
	assert(getNodeVar(i).isFixed());
	assert(getNodeVar(i).isTrue());
	in_nodes_tsize++;
	in_nodes_size++;
	in_nodes_list.push_back(i);
}